

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

bool __thiscall
hanabi_learning_env::HanabiState::CardPlayableOnFireworks(HanabiState *this,HanabiCard card)

{
  uint uVar1;
  
  uVar1 = card.color_;
  if ((-1 < (int)uVar1) && ((int)uVar1 < this->parent_game_->num_colors_)) {
    return (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1 & 0x7fffffff] == card.rank_;
  }
  return false;
}

Assistant:

bool HanabiState::CardPlayableOnFireworks(int color, int rank) const {
  if (color < 0 || color >= ParentGame()->NumColors()) {
    return false;
  }
  return rank == fireworks_[color];
}